

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall TPZTensor<TFad<6,_double>_>::TPZDecomposed::Print(TPZDecomposed *this,ostream *out)

{
  uint uVar1;
  ostream *poVar2;
  uint *puVar3;
  int64_t iVar4;
  TPZManVector<TFad<6,_double>,_3> *pTVar5;
  TPZTensor<TFad<6,_double>_> *in_RSI;
  char *pcVar6;
  uint *in_RDI;
  uint v;
  uint geoMult;
  uint lambda;
  uint vIndex;
  TPZTensor<TFad<6,_double>_> *in_stack_ffffffffffffffb8;
  TPZTensor<TFad<6,_double>_> *in_stack_ffffffffffffffc0;
  uint local_20;
  uint uVar7;
  uint uVar8;
  TPZTensor<TFad<6,_double>_> *pTVar9;
  
  poVar2 = std::operator<<((ostream *)in_RSI,"TPZTensor::Decomposed Eigenvalues (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*in_RDI);
  poVar2 = std::operator<<(poVar2," distinct):");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  uVar8 = 0;
  uVar7 = 0;
  do {
    puVar3 = TPZVec<unsigned_int>::operator[]((TPZVec<unsigned_int> *)(in_RDI + 2),(ulong)uVar7);
    uVar1 = *puVar3;
    std::operator<<((ostream *)in_RSI,"Eigenvalue: ");
    TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 0xe),(ulong)uVar7);
    poVar2 = ::operator<<((ostream *)in_stack_ffffffffffffffc0,
                          (TFad<6,_double> *)in_stack_ffffffffffffffb8);
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
    poVar2 = std::operator<<(poVar2," time");
    pcVar6 = "";
    if (1 < uVar1) {
      pcVar6 = "s";
    }
    poVar2 = std::operator<<(poVar2,pcVar6);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)in_RSI,"Eigenvector");
    pcVar6 = "";
    if (1 < uVar1) {
      pcVar6 = "s";
    }
    poVar2 = std::operator<<(poVar2,pcVar6);
    poVar2 = std::operator<<(poVar2,":");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    iVar4 = TPZVec<TPZManVector<TFad<6,_double>,_3>_>::size
                      ((TPZVec<TPZManVector<TFad<6,_double>,_3>_> *)(in_RDI + 0x46));
    if (iVar4 == 0) {
LAB_014b10aa:
      poVar2 = std::operator<<((ostream *)in_RSI," Not computed.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      pTVar5 = TPZVec<TPZManVector<TFad<6,_double>,_3>_>::operator[]
                         ((TPZVec<TPZManVector<TFad<6,_double>,_3>_> *)(in_RDI + 0x46),0);
      iVar4 = TPZVec<TFad<6,_double>_>::size(&pTVar5->super_TPZVec<TFad<6,_double>_>);
      if (iVar4 == 0) goto LAB_014b10aa;
      for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
        pTVar9 = in_RSI;
        pTVar5 = TPZVec<TPZManVector<TFad<6,_double>,_3>_>::operator[]
                           ((TPZVec<TPZManVector<TFad<6,_double>,_3>_> *)(in_RDI + 0x46),
                            (ulong)uVar8);
        TPZVec<TFad<6,_double>_>::operator[](&pTVar5->super_TPZVec<TFad<6,_double>_>,0);
        poVar2 = ::operator<<((ostream *)in_stack_ffffffffffffffc0,(TFad<6,_double> *)in_RSI);
        in_stack_ffffffffffffffc0 = pTVar9;
        std::operator<<(poVar2," ");
        pTVar9 = in_stack_ffffffffffffffc0;
        pTVar5 = TPZVec<TPZManVector<TFad<6,_double>,_3>_>::operator[]
                           ((TPZVec<TPZManVector<TFad<6,_double>,_3>_> *)(in_RDI + 0x46),
                            (ulong)uVar8);
        TPZVec<TFad<6,_double>_>::operator[](&pTVar5->super_TPZVec<TFad<6,_double>_>,1);
        poVar2 = ::operator<<((ostream *)in_stack_ffffffffffffffc0,(TFad<6,_double> *)in_RSI);
        std::operator<<(poVar2," ");
        pTVar5 = TPZVec<TPZManVector<TFad<6,_double>,_3>_>::operator[]
                           ((TPZVec<TPZManVector<TFad<6,_double>,_3>_> *)(in_RDI + 0x46),
                            (ulong)uVar8);
        TPZVec<TFad<6,_double>_>::operator[](&pTVar5->super_TPZVec<TFad<6,_double>_>,2);
        poVar2 = ::operator<<((ostream *)in_stack_ffffffffffffffc0,(TFad<6,_double> *)in_RSI);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        uVar8 = uVar8 + 1;
        in_stack_ffffffffffffffb8 = in_RSI;
        in_RSI = pTVar9;
      }
    }
    poVar2 = std::operator<<((ostream *)in_RSI,"Eigentensor:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    TPZVec<TPZTensor<TFad<6,_double>_>_>::operator[]
              ((TPZVec<TPZTensor<TFad<6,_double>_>_> *)(in_RDI + 0xf6),(ulong)uVar7);
    TPZTensor<TFad<6,_double>_>::Print(in_RSI,(ostream *)CONCAT44(uVar8,uVar7));
    std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
    uVar7 = uVar1 + uVar7;
    if (2 < uVar7) {
      return;
    }
  } while( true );
}

Assistant:

void Print(std::ostream &out) const {
#ifdef PZ_LOG
            if (fDistinctEigenvalues == 0 || fDistinctEigenvalues > 3) {
                std::stringstream str;
                str << "TPZTensor::Decomposed::Print Invalid number of distinct eigenvalues: " << fDistinctEigenvalues << std::endl;
                LOGPZ_DEBUG(loggerr, str.str());
            }
#endif
            out << "TPZTensor::Decomposed Eigenvalues (" << fDistinctEigenvalues << " distinct):" << std::endl;
            unsigned int vIndex = 0;
            unsigned int lambda = 0;
            do {
                const unsigned int geoMult(fGeometricMultiplicity[lambda]);
#ifdef PZ_LOG
                if (geoMult == 0 || geoMult > 3) {
                    std::stringstream str;
                    str << "TPZTensor::Decomposed::Print Invalid geometric multiplicity (" << geoMult << ") for eigenvalue " << fEigenvalues[lambda] << std::endl;
                    LOGPZ_DEBUG(loggerr, str.str());
                }
#endif
                out << "Eigenvalue: " << fEigenvalues[lambda] << " (" << geoMult << " time" << (geoMult > 1 ? "s" : "") << ")" << std::endl;
                out << "Eigenvector" << (geoMult > 1 ? "s" : "") << ":" << std::endl;
                if (fEigenvectors.size() == 0 || fEigenvectors[0].size() == 0) {
                    out << " Not computed." << std::endl;
                } else {
                    for (unsigned int v = 0; v < geoMult; ++v) {
                        out << fEigenvectors[vIndex][0] << " ";
                        out << fEigenvectors[vIndex][1] << " ";
                        out << fEigenvectors[vIndex][2] << std::endl;
                        ++vIndex;
                    }
                }
                out << "Eigentensor:" << std::endl;
                fEigentensors[lambda].Print(out);
                out << std::endl;
                lambda += geoMult; // Go to next distinct eigenvalue
#ifdef PZDEBUG
                if (lambda > 3) {
                    std::stringstream str;
                    str << "TPZTensor::Decomposed::Print Total geometric multiplicity greater than expected!" << std::endl;
                    LOGPZ_ERROR(loggerr, str.str());
                }
#endif
            } while (lambda < 3);
        }